

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

void __thiscall Kumu::FileReader::~FileReader(FileReader *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Result_t local_70;
  
  (this->super_IFileReader)._vptr_IFileReader = (_func_int **)&PTR__FileReader_001249a8;
  Close(&local_70,this);
  Result_t::~Result_t(&local_70);
  pcVar1 = (this->m_Filename)._M_dataplus._M_p;
  paVar2 = &(this->m_Filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Kumu::FileReader::~FileReader()
{
  Kumu::FileReader::Close();
}